

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeGPRPairRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  DecodeStatus S;
  uint RegisterPair;
  DecodeStatus local_30;
  DecodeStatus local_4;
  
  local_30 = MCDisassembler_Success;
  if (in_ESI < 0xe) {
    if (((in_ESI & 1) != 0) || (in_ESI == 0xe)) {
      local_30 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateReg0(in_RDI,(uint)GPRPairDecoderTable[in_ESI >> 1]);
    local_4 = local_30;
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeGPRPairRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned RegisterPair;
	DecodeStatus S = MCDisassembler_Success;

	if (RegNo > 13)
		return MCDisassembler_Fail;

	if ((RegNo & 1) || RegNo == 0xe)
		S = MCDisassembler_SoftFail;

	RegisterPair = GPRPairDecoderTable[RegNo/2];
	MCOperand_CreateReg0(Inst, RegisterPair);
	return S;
}